

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int64_t get_warp_error(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int ref_width,
                      int ref_height,int ref_stride,uint8_t *dst,int dst_stride,int p_col,int p_row,
                      int p_width,int p_height,int subsampling_x,int subsampling_y,
                      int64_t best_error,uint8_t *segment_map,int segment_map_stride)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000050;
  int64_t in_stack_00000058;
  undefined4 in_stack_00000060;
  uint8_t *in_stack_000003d8;
  int in_stack_000003e4;
  int in_stack_000003e8;
  int in_stack_000003ec;
  uint8_t *in_stack_000003f0;
  WarpedMotionParams *in_stack_000003f8;
  int in_stack_00000430;
  int in_stack_00000438;
  int in_stack_00000440;
  int in_stack_00000448;
  int in_stack_00000450;
  int in_stack_00000458;
  int in_stack_00000460;
  int64_t in_stack_00000468;
  uint8_t *in_stack_00000470;
  int in_stack_00000478;
  uint16_t *in_stack_000007e8;
  int in_stack_000007f4;
  int in_stack_000007f8;
  int in_stack_000007fc;
  uint16_t *in_stack_00000800;
  WarpedMotionParams *in_stack_00000808;
  WarpedMotionParams *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined8 local_38;
  
  iVar1 = av1_get_shear_params(in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    local_38 = 0x7fffffffffffffff;
  }
  else if (in_ESI == 0) {
    local_38 = warp_error(in_stack_000003f8,in_stack_000003f0,in_stack_000003ec,in_stack_000003e8,
                          in_stack_000003e4,in_stack_000003d8,in_stack_00000430,in_stack_00000438,
                          in_stack_00000440,in_stack_00000448,in_stack_00000450,in_stack_00000458,
                          in_stack_00000460,in_stack_00000468,in_stack_00000470,in_stack_00000478);
  }
  else {
    local_38 = highbd_warp_error(in_stack_00000808,in_stack_00000800,in_stack_000007fc,
                                 in_stack_000007f8,in_stack_000007f4,in_stack_000007e8,
                                 in_stack_00000020,in_stack_00000028,in_stack_00000030,
                                 in_stack_00000038,in_stack_00000040,in_stack_00000048,in_EDX,
                                 in_stack_00000050,in_stack_00000058,
                                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_00000060),
                                 in_stack_ffffffffffffff90);
  }
  return local_38;
}

Assistant:

static int64_t get_warp_error(WarpedMotionParams *wm, int use_hbd, int bd,
                              const uint8_t *ref, int ref_width, int ref_height,
                              int ref_stride, uint8_t *dst, int dst_stride,
                              int p_col, int p_row, int p_width, int p_height,
                              int subsampling_x, int subsampling_y,
                              int64_t best_error, uint8_t *segment_map,
                              int segment_map_stride) {
  if (!av1_get_shear_params(wm)) return INT64_MAX;
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    return highbd_warp_error(wm, CONVERT_TO_SHORTPTR(ref), ref_width,
                             ref_height, ref_stride, CONVERT_TO_SHORTPTR(dst),
                             dst_stride, p_col, p_row, p_width, p_height,
                             subsampling_x, subsampling_y, bd, best_error,
                             segment_map, segment_map_stride);
#endif
  (void)use_hbd;
  (void)bd;
  return warp_error(wm, ref, ref_width, ref_height, ref_stride, dst, dst_stride,
                    p_col, p_row, p_width, p_height, subsampling_x,
                    subsampling_y, best_error, segment_map, segment_map_stride);
}